

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  bool bVar1;
  uint local_3c;
  curl_slist *pcStack_38;
  int port;
  char *host;
  curl_slist *pcStack_28;
  CURLcode result;
  curl_slist *conn_to_host_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  host._4_4_ = CURLE_OK;
  pcStack_38 = (curl_slist *)0x0;
  local_3c = 0xffffffff;
  pcStack_28 = conn_to_host;
  conn_to_host_local = (curl_slist *)conn;
  conn_local = (connectdata *)data;
  while( true ) {
    bVar1 = false;
    if ((pcStack_28 != (curl_slist *)0x0) && (bVar1 = false, pcStack_38 == (curl_slist *)0x0)) {
      bVar1 = local_3c == 0xffffffff;
    }
    if (!bVar1) break;
    host._4_4_ = parse_connect_to_string
                           ((Curl_easy *)conn_local,(connectdata *)conn_to_host_local,
                            pcStack_28->data,(char **)&stack0xffffffffffffffc8,(int *)&local_3c);
    if (host._4_4_ != CURLE_OK) {
      return host._4_4_;
    }
    if ((pcStack_38 == (curl_slist *)0x0) || (*(char *)&pcStack_38->data == '\0')) {
      *(uint *)((long)&conn_to_host_local[0x37].data + 4) =
           *(uint *)((long)&conn_to_host_local[0x37].data + 4) & 0xfffffdff;
      (*Curl_cfree)(pcStack_38);
      pcStack_38 = (curl_slist *)0x0;
    }
    else {
      conn_to_host_local[0xb].next = pcStack_38;
      conn_to_host_local[0xc].next = pcStack_38;
      *(uint *)((long)&conn_to_host_local[0x37].data + 4) =
           *(uint *)((long)&conn_to_host_local[0x37].data + 4) & 0xfffffdff | 0x200;
      Curl_infof((Curl_easy *)conn_local,"Connecting to hostname: %s",pcStack_38);
    }
    if ((int)local_3c < 0) {
      *(uint *)((long)&conn_to_host_local[0x37].data + 4) =
           *(uint *)((long)&conn_to_host_local[0x37].data + 4) & 0xfffffbff;
      local_3c = 0xffffffff;
    }
    else {
      *(uint *)&conn_to_host_local[0x57].data = local_3c;
      *(uint *)((long)&conn_to_host_local[0x37].data + 4) =
           *(uint *)((long)&conn_to_host_local[0x37].data + 4) & 0xfffffbff | 0x400;
      Curl_infof((Curl_easy *)conn_local,"Connecting to port: %d",(ulong)local_3c);
    }
    pcStack_28 = pcStack_28->next;
  }
  return host._4_4_;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     ((conn->handler->protocol == CURLPROTO_HTTPS) ||
#ifdef CURLDEBUG
      /* allow debug builds to circumvent the HTTPS restriction */
      getenv("CURL_ALTSVC_HTTP")
#else
      0
#endif
       )) {
    /* no connect_to match, try alt-svc! */
    enum alpnid srcalpnid;
    bool hit;
    struct altsvc *as;
    const int allowed_versions = ( ALPN_h1
#ifdef USE_HTTP2
                                   | ALPN_h2
#endif
#ifdef ENABLE_QUIC
                                   | ALPN_h3
#endif
      ) & data->asi->flags;

    host = conn->host.rawalloc;
#ifdef USE_HTTP2
    /* with h2 support, check that first */
    srcalpnid = ALPN_h2;
    hit = Curl_altsvc_lookup(data->asi,
                             srcalpnid, host, conn->remote_port, /* from */
                             &as /* to */,
                             allowed_versions);
    if(!hit)
#endif
    {
      srcalpnid = ALPN_h1;
      hit = Curl_altsvc_lookup(data->asi,
                               srcalpnid, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_versions);
    }
    if(hit) {
      char *hostd = strdup((char *)as->dst.host);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = as->dst.port;
      conn->bits.conn_to_port = TRUE;
      conn->bits.altused = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",
            Curl_alpnid2str(srcalpnid), host, conn->remote_port,
            Curl_alpnid2str(as->dst.alpnid), hostd, as->dst.port);
      if(srcalpnid != as->dst.alpnid) {
        /* protocol version switch */
        switch(as->dst.alpnid) {
        case ALPN_h1:
          conn->httpversion = 11;
          break;
        case ALPN_h2:
          conn->httpversion = 20;
          break;
        case ALPN_h3:
          conn->transport = TRNSPRT_QUIC;
          conn->httpversion = 30;
          break;
        default: /* shouldn't be possible */
          break;
        }
      }
    }
  }
#endif

  return result;
}